

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int freeSpace(MemPage *pPage,u16 iStart,u16 iSize)

{
  u32 uVar1;
  u8 *puVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ushort uVar7;
  uint uVar8;
  undefined6 in_register_00000012;
  uint uVar9;
  ulong uVar10;
  undefined6 in_register_00000032;
  ulong uVar11;
  byte bVar12;
  ushort uVar13;
  uint uVar14;
  uint uVar15;
  u16 uVar16;
  
  uVar10 = CONCAT62(in_register_00000032,iStart) & 0xffffffff;
  puVar2 = pPage->aData;
  uVar1 = pPage->pBt->usableSize;
  if ((pPage->pBt->btsFlags & 0xc) != 0) {
    memset(puVar2 + iStart,0,(ulong)iSize);
  }
  uVar9 = (uint)CONCAT62(in_register_00000032,iStart);
  uVar8 = (int)CONCAT62(in_register_00000012,iSize) + uVar9;
  uVar5 = (ulong)pPage->hdrOffset;
  uVar6 = uVar5 + 1;
  uVar16 = iSize;
  if ((puVar2[uVar5 + 2] == '\0') && (puVar2[uVar6] == '\0')) {
    uVar7 = 0;
    uVar11 = uVar6;
  }
  else {
    uVar3 = uVar6;
    do {
      uVar11 = uVar3;
      uVar13 = *(ushort *)(puVar2 + uVar11);
      uVar7 = uVar13 << 8 | uVar13 >> 8;
      uVar14 = (uint)uVar7;
      uVar15 = (uint)uVar11;
      if ((ushort)uVar10 <= uVar7) goto LAB_0013bffd;
      uVar3 = (ulong)uVar7;
    } while (uVar15 + 4 <= uVar14);
    if (uVar7 != 0) {
      iVar4 = 0xef25;
      goto LAB_0013c150;
    }
LAB_0013bffd:
    if (uVar1 - 4 < uVar14) {
      iVar4 = 0xef29;
      goto LAB_0013c150;
    }
    if (uVar8 + 3 < uVar14 || uVar7 == 0) {
      bVar12 = 0;
    }
    else {
      bVar12 = (char)(uVar13 >> 8) - (char)uVar8;
      if (uVar7 < uVar8) {
        iVar4 = 0xef34;
        goto LAB_0013c150;
      }
      uVar8 = (ushort)(*(ushort *)(puVar2 + (ulong)uVar7 + 2) << 8 |
                      *(ushort *)(puVar2 + (ulong)uVar7 + 2) >> 8) + uVar14;
      if (pPage->pBt->usableSize < uVar8) {
        iVar4 = 0xef37;
        goto LAB_0013c150;
      }
      uVar16 = (short)uVar8 - iStart;
      uVar7 = *(ushort *)(puVar2 + uVar7) << 8 | *(ushort *)(puVar2 + uVar7) >> 8;
    }
    if (((uint)uVar6 < uVar15) &&
       (uVar13 = *(ushort *)(puVar2 + uVar11 + 2) << 8 | *(ushort *)(puVar2 + uVar11 + 2) >> 8,
       uVar9 <= uVar13 + uVar15 + 3)) {
      uVar15 = uVar13 + uVar15;
      if (uVar9 < uVar15) {
        iVar4 = 0xef44;
        goto LAB_0013c150;
      }
      bVar12 = bVar12 + ((char)iStart - (char)uVar15);
      uVar16 = (short)uVar8 - (short)uVar11;
      uVar10 = uVar11;
    }
    if (puVar2[uVar5 + 7] < bVar12) {
      iVar4 = 0xef4a;
      goto LAB_0013c150;
    }
    puVar2[uVar5 + 7] = puVar2[uVar5 + 7] - bVar12;
    uVar9 = (uint)uVar10 & 0xffff;
  }
  if ((ushort)(*(ushort *)(puVar2 + uVar5 + 5) << 8 | *(ushort *)(puVar2 + uVar5 + 5) >> 8) == uVar9
     ) {
    if ((uint)uVar6 != (uint)uVar11) {
      iVar4 = 0xef51;
LAB_0013c150:
      iVar4 = sqlite3CorruptError(iVar4);
      return iVar4;
    }
    *(ushort *)(puVar2 + uVar6) = uVar7 << 8 | uVar7 >> 8;
    puVar2[uVar5 + 5] = (u8)(uVar8 >> 8);
    puVar2[uVar5 + 6] = (u8)uVar8;
  }
  else {
    uVar6 = uVar10 & 0xffff;
    *(ushort *)(puVar2 + uVar11) = (ushort)uVar10 << 8 | (ushort)uVar10 >> 8;
    puVar2[uVar6] = (u8)(uVar7 >> 8);
    puVar2[uVar6 + 1] = (u8)uVar7;
    puVar2[uVar6 + 2] = (u8)(uVar16 >> 8);
    puVar2[uVar6 + 3] = (u8)uVar16;
  }
  pPage->nFree = pPage->nFree + iSize;
  return 0;
}

Assistant:

static int freeSpace(MemPage *pPage, u16 iStart, u16 iSize){
  u16 iPtr;                             /* Address of ptr to next freeblock */
  u16 iFreeBlk;                         /* Address of the next freeblock */
  u8 hdr;                               /* Page header size.  0 or 100 */
  u8 nFrag = 0;                         /* Reduction in fragmentation */
  u16 iOrigSize = iSize;                /* Original value of iSize */
  u32 iLast = pPage->pBt->usableSize-4; /* Largest possible freeblock offset */
  u32 iEnd = iStart + iSize;            /* First byte past the iStart buffer */
  unsigned char *data = pPage->aData;   /* Page content */

  assert( pPage->pBt!=0 );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( CORRUPT_DB || iStart>=pPage->hdrOffset+6+pPage->childPtrSize );
  assert( CORRUPT_DB || iEnd <= pPage->pBt->usableSize );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( iSize>=4 );   /* Minimum cell size is 4 */
  assert( iStart<=iLast );

  /* Overwrite deleted information with zeros when the secure_delete
  ** option is enabled */
  if( pPage->pBt->btsFlags & BTS_FAST_SECURE ){
    memset(&data[iStart], 0, iSize);
  }

  /* The list of freeblocks must be in ascending order.  Find the 
  ** spot on the list where iStart should be inserted.
  */
  hdr = pPage->hdrOffset;
  iPtr = hdr + 1;
  if( data[iPtr+1]==0 && data[iPtr]==0 ){
    iFreeBlk = 0;  /* Shortcut for the case when the freelist is empty */
  }else{
    while( (iFreeBlk = get2byte(&data[iPtr]))<iStart ){
      if( iFreeBlk<iPtr+4 ){
        if( iFreeBlk==0 ) break;
        return SQLITE_CORRUPT_PGNO(pPage->pgno);
      }
      iPtr = iFreeBlk;
    }
    if( iFreeBlk>iLast ) return SQLITE_CORRUPT_PGNO(pPage->pgno);
    assert( iFreeBlk>iPtr || iFreeBlk==0 );
  
    /* At this point:
    **    iFreeBlk:   First freeblock after iStart, or zero if none
    **    iPtr:       The address of a pointer to iFreeBlk
    **
    ** Check to see if iFreeBlk should be coalesced onto the end of iStart.
    */
    if( iFreeBlk && iEnd+3>=iFreeBlk ){
      nFrag = iFreeBlk - iEnd;
      if( iEnd>iFreeBlk ) return SQLITE_CORRUPT_PGNO(pPage->pgno);
      iEnd = iFreeBlk + get2byte(&data[iFreeBlk+2]);
      if( iEnd > pPage->pBt->usableSize ){
        return SQLITE_CORRUPT_PGNO(pPage->pgno);
      }
      iSize = iEnd - iStart;
      iFreeBlk = get2byte(&data[iFreeBlk]);
    }
  
    /* If iPtr is another freeblock (that is, if iPtr is not the freelist
    ** pointer in the page header) then check to see if iStart should be
    ** coalesced onto the end of iPtr.
    */
    if( iPtr>hdr+1 ){
      int iPtrEnd = iPtr + get2byte(&data[iPtr+2]);
      if( iPtrEnd+3>=iStart ){
        if( iPtrEnd>iStart ) return SQLITE_CORRUPT_PGNO(pPage->pgno);
        nFrag += iStart - iPtrEnd;
        iSize = iEnd - iPtr;
        iStart = iPtr;
      }
    }
    if( nFrag>data[hdr+7] ) return SQLITE_CORRUPT_PGNO(pPage->pgno);
    data[hdr+7] -= nFrag;
  }
  if( iStart==get2byte(&data[hdr+5]) ){
    /* The new freeblock is at the beginning of the cell content area,
    ** so just extend the cell content area rather than create another
    ** freelist entry */
    if( iPtr!=hdr+1 ) return SQLITE_CORRUPT_PGNO(pPage->pgno);
    put2byte(&data[hdr+1], iFreeBlk);
    put2byte(&data[hdr+5], iEnd);
  }else{
    /* Insert the new freeblock into the freelist */
    put2byte(&data[iPtr], iStart);
    put2byte(&data[iStart], iFreeBlk);
    put2byte(&data[iStart+2], iSize);
  }
  pPage->nFree += iOrigSize;
  return SQLITE_OK;
}